

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O1

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxVertex[]>(mmd *this,size_t n)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  size_t *psVar5;
  long lVar6;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = n;
  uVar3 = SUB168(auVar2 * ZEXT816(0x78),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x78),8) == 0) {
    uVar3 = uVar4;
  }
  psVar5 = (size_t *)operator_new__(uVar3);
  *psVar5 = n;
  if (n != 0) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)psVar5 + lVar6 + 0x70) = 0;
      *(undefined4 *)((long)psVar5 + lVar6 + 0x78) = 0;
      puVar1 = (undefined8 *)((long)psVar5 + lVar6 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)psVar5 + lVar6 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)psVar5 + lVar6 + 0x28);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)psVar5 + lVar6 + 0x38);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)psVar5 + lVar6 + 0x48);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)psVar5 + lVar6 + 0x58);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar6 = lVar6 + 0x78;
    } while (n * 0x78 - lVar6 != 0);
  }
  *(size_t **)this = psVar5 + 1;
  return (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }